

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O1

void __thiscall ParseInt64_Underscores_Test::TestBody(ParseInt64_Underscores_Test *this)

{
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0x75bcd15,"12_345_6789",Both);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0x75bcd15,"+12_345_6789",SignedAndUnsigned);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0xfffffffff8a432eb,"-12345_6789",SignedAndUnsigned);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0x13,"1______9",Both);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0xabcd,"0xa_b_c_d",Both);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0xabcd,"+0xa_b_c_d",SignedAndUnsigned);
  anon_unknown.dwarf_a8e78::AssertInt64Equals(0xffffffffffff5433,"-0xa_b_c_d",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt64, Underscores) {
  AssertInt64Equals(123456789, "12_345_6789", Both);
  AssertInt64Equals(123456789, "+12_345_6789", SignedAndUnsigned);
  AssertInt64Equals(-123456789, "-12345_6789", SignedAndUnsigned);
  AssertInt64Equals(19, "1______9", Both);
  AssertInt64Equals(0xabcd, "0xa_b_c_d", Both);
  AssertInt64Equals(0xabcd, "+0xa_b_c_d", SignedAndUnsigned);
  AssertInt64Equals(-0xabcd, "-0xa_b_c_d", SignedAndUnsigned);
}